

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall Tokenizer::nextToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  Mark *pMVar3;
  runtime_error *this_00;
  undefined1 local_81;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_80;
  undefined1 local_78 [24];
  undefined1 local_60 [16];
  byte local_50;
  Mark local_48;
  string local_40;
  
  cVar1 = Stream::peek(&this->stream_);
  if (cVar1 == -1) {
    pMVar3 = Stream::getMark(&this->stream_);
    local_78._0_4_ = EOT;
    local_78._8_8_ = local_60;
    local_78._16_8_ = 0;
    local_60[0] = '\0';
    local_50 = 0;
    local_48 = *pMVar3;
    (this->token_).type = EOT;
    local_80 = &(this->token_).value;
    std::operator=(&local_80,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    *)(local_78 + 8),&local_81);
    (this->token_).mark = local_48;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_50]._M_data)
              ((anon_class_1_0_00000001 *)&local_80,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)(local_78 + 8));
  }
  else {
    do {
      do {
        bVar2 = tryToSkipSpaces(this);
      } while (bVar2);
      bVar2 = tryToSkipComments(this);
    } while (bVar2);
    bVar2 = tryToGetKeywordOrIdentifier(this);
    if (!bVar2) {
      bVar2 = tryToGetString(this);
      if (!bVar2) {
        bVar2 = tryToGetNumber(this);
        if (!bVar2) {
          bVar2 = tryToGetSingleCharToken(this);
          if (!bVar2) {
            bVar2 = tryToGetCompoundToken(this);
            if (!bVar2) {
              cVar1 = Stream::peek(&this->stream_);
              if (cVar1 != -1) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_40,"Unexpected character!","");
                makeErrorMessage((string *)local_78,this,&local_40);
                std::runtime_error::runtime_error(this_00,(string *)local_78);
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pMVar3 = Stream::getMark(&this->stream_);
              local_78._8_8_ = local_60;
              local_78._0_4_ = EOT;
              local_78._16_8_ = 0;
              local_60[0] = '\0';
              local_50 = 0;
              local_48 = *pMVar3;
              Token::operator=(&this->token_,(Token *)local_78);
              Token::~Token((Token *)local_78);
            }
          }
        }
      }
    }
  }
  __return_storage_ptr__->type = (this->token_).type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&__return_storage_ptr__->value,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&(this->token_).value);
  __return_storage_ptr__->mark = (this->token_).mark;
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::nextToken()
{
  if(stream_.peek() != EOF)
  {
    while(tryToSkipSpaces() || tryToSkipComments());

    if(tryToGetKeywordOrIdentifier())
      return token_;
    else if(tryToGetString())
      return token_;
    else if(tryToGetNumber())
      return token_;
    else if(tryToGetSingleCharToken())
      return token_;
    else if(tryToGetCompoundToken())
      return token_;
    else if(stream_.peek() == EOF)
      token_ = Token{stream_.getMark()};
    else
      throw std::runtime_error(makeErrorMessage("Unexpected character!"));
  }
  else
    token_ = Token{stream_.getMark()};

  return token_;
}